

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O3

JL_STATUS JlGetObjectDictionaryNextItem
                    (JlDataObject *DictionaryObject,JlDataObject **pNextObject,char **pKeyName,
                    JlDictionaryItem **pEnumerator)

{
  JL_STATUS JVar1;
  JlDictionaryItem *pJVar2;
  char *pcVar3;
  undefined4 in_R8D;
  int iVar4;
  undefined1 auVar5 [16];
  
  auVar5._0_4_ = -(uint)(DictionaryObject == (JlDataObject *)0x0);
  auVar5._4_4_ = -(uint)(pNextObject == (JlDataObject **)0x0);
  auVar5._8_4_ = -(uint)(pKeyName == (char **)0x0);
  auVar5._12_4_ = -(uint)(pEnumerator == (JlDictionaryItem **)0x0);
  iVar4 = movmskps(in_R8D,auVar5);
  JVar1 = JL_STATUS_INVALID_PARAMETER;
  if ((iVar4 != 0) ||
     (JVar1 = JL_STATUS_WRONG_TYPE, DictionaryObject->Type != JL_DATA_TYPE_DICTIONARY)) {
    return JVar1;
  }
  pJVar2 = *pEnumerator;
  if (pJVar2 == (JlDictionaryItem *)0x0) {
    pJVar2 = (DictionaryObject->field_2).Dictionary.DictionaryHead;
    *pEnumerator = pJVar2;
    if (pJVar2 == (JlDictionaryItem *)0x0) goto LAB_0010203f;
    *pNextObject = pJVar2->Object;
    pJVar2 = (DictionaryObject->field_2).Dictionary.DictionaryHead;
  }
  else {
    if (pJVar2->ParentDictionary != (JlDictionary *)&DictionaryObject->field_2) {
      return JL_STATUS_WRONG_TYPE;
    }
    pJVar2 = pJVar2->Next;
    *pEnumerator = pJVar2;
    if (pJVar2 == (JlDictionaryItem *)0x0) {
LAB_0010203f:
      *pNextObject = (JlDataObject *)0x0;
      JVar1 = JL_STATUS_END_OF_DATA;
      pcVar3 = (char *)0x0;
      goto LAB_0010204d;
    }
    *pNextObject = pJVar2->Object;
    pJVar2 = *pEnumerator;
  }
  pcVar3 = pJVar2->KeyName;
  JVar1 = JL_STATUS_SUCCESS;
LAB_0010204d:
  *pKeyName = pcVar3;
  return JVar1;
}

Assistant:

JL_STATUS
    JlGetObjectDictionaryNextItem
    (
        JlDataObject const*       DictionaryObject,
        JlDataObject**            pNextObject,
        char const**              pKeyName,
        JlDictionaryItem**        pEnumerator
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != pNextObject
        &&  NULL != pKeyName
        &&  NULL != pEnumerator )
    {
        if(     JL_DATA_TYPE_DICTIONARY == DictionaryObject->Type
            &&  ( NULL == *pEnumerator  || (*pEnumerator)->ParentDictionary == &DictionaryObject->Dictionary ) )
        {
            if( NULL == *pEnumerator )
            {
                // Get first item
                *pEnumerator = DictionaryObject->Dictionary.DictionaryHead;
                if( NULL != DictionaryObject->Dictionary.DictionaryHead )
                {
                    *pNextObject = DictionaryObject->Dictionary.DictionaryHead->Object;
                    *pKeyName    = DictionaryObject->Dictionary.DictionaryHead->KeyName;
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    // Empty dictionary
                    *pNextObject = NULL;
                    *pKeyName = NULL;
                    jlStatus = JL_STATUS_END_OF_DATA;
                }
            }
            else
            {
                // Move enumerator to next item.
                *pEnumerator = (*pEnumerator)->Next;
                if( NULL != *pEnumerator )
                {
                    *pNextObject = (*pEnumerator)->Object;
                    *pKeyName    = (*pEnumerator)->KeyName;
                    jlStatus = JL_STATUS_SUCCESS;
                }
                else
                {
                    *pNextObject = NULL;
                    *pKeyName    = NULL;
                    jlStatus = JL_STATUS_END_OF_DATA;
                }
            }
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}